

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  IfcStructuralActivity *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                              super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcStructuralActivity *)
            (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
              super_IfcObject.field_0x0 + lVar2);
  plVar1 = (long *)(&(this->super_IfcStructuralAction).field_0x158 + lVar2);
  plVar1[-0x2b] = 0x8c8b28;
  plVar1[6] = 0x8c8c18;
  plVar1[-0x1a] = 0x8c8b50;
  plVar1[-0x18] = 0x8c8b78;
  plVar1[-0x11] = 0x8c8ba0;
  plVar1[-0xb] = 0x8c8bc8;
  plVar1[-4] = 0x8c8bf0;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity(this_00,&PTR_construction_vtable_24__008c8998);
  operator_delete(this_00,0x1a0);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}